

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetPointerType
          (InterfaceVariableScalarReplacement *this,uint32_t type_id,StorageClass storage_class)

{
  uint32_t uVar1;
  TypeManager *pTVar2;
  Type *type;
  Pointer ptr_type;
  Pointer PStack_58;
  
  pTVar2 = IRContext::get_type_mgr((this->super_Pass).context_);
  type = analysis::TypeManager::GetType(pTVar2,type_id);
  analysis::Pointer::Pointer(&PStack_58,type,storage_class);
  pTVar2 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar1 = analysis::TypeManager::GetTypeInstruction(pTVar2,&PStack_58.super_Type);
  analysis::Type::~Type(&PStack_58.super_Type);
  return uVar1;
}

Assistant:

uint32_t InterfaceVariableScalarReplacement::GetPointerType(
    uint32_t type_id, spv::StorageClass storage_class) {
  analysis::Type* type = context()->get_type_mgr()->GetType(type_id);
  analysis::Pointer ptr_type(type, storage_class);
  return context()->get_type_mgr()->GetTypeInstruction(&ptr_type);
}